

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

upb_Array * upb_Array_New(upb_Arena *a,upb_CType type)

{
  byte bVar1;
  upb_Array *puVar2;
  ulong size;
  
  bVar1 = _upb_CType_SizeLg2_dont_copy_me__upb_internal_use_only_size[type - kUpb_CType_Bool];
  size = (4L << (bVar1 & 0x3f)) + 0x1fU & 0xfffffffffffffff8;
  puVar2 = (upb_Array *)a->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)puVar2) < size) {
    puVar2 = (upb_Array *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,size);
  }
  else {
    if ((upb_Array *)
        ((ulong)((long)&puVar2->data_dont_copy_me__upb_internal_use_only + 7U) & 0xfffffffffffffff8)
        != puVar2) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    a->ptr_dont_copy_me__upb_internal_use_only =
         (char *)((long)&puVar2->data_dont_copy_me__upb_internal_use_only + size);
  }
  if (puVar2 != (upb_Array *)0x0) {
    puVar2->data_dont_copy_me__upb_internal_use_only =
         ((ulong)(uint)(int)(char)bVar1 - 1) + (ulong)(type - kUpb_CType_Bool == 0) |
         (ulong)(puVar2 + 1);
    puVar2->size_dont_copy_me__upb_internal_use_only = 0;
    puVar2->capacity_dont_copy_me__upb_internal_use_only = 4;
  }
  return puVar2;
}

Assistant:

upb_Array* upb_Array_New(upb_Arena* a, upb_CType type) {
  const int lg2 = UPB_PRIVATE(_upb_CType_SizeLg2)(type);
  return UPB_PRIVATE(_upb_Array_New)(a, 4, lg2);
}